

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Options::Parse(Options *this,int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  reference pvVar5;
  pointer ppVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  char *local_e0;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Base_ptr local_70;
  undefined1 local_68;
  _Self local_60;
  _Self local_58;
  iterator it;
  undefined1 local_48 [4];
  int ch;
  char **local_28;
  char **argv_local;
  Options *pOStack_18;
  int argc_local;
  Options *this_local;
  
  local_28 = argv;
  argv_local._4_4_ = argc;
  pOStack_18 = this;
  memset(local_48,0,0x20);
  std::vector<option,_std::allocator<option>_>::push_back(&this->options,(value_type *)local_48);
  while( true ) {
    iVar2 = argv_local._4_4_;
    ppcVar1 = local_28;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->optstr);
    pvVar5 = std::vector<option,_std::allocator<option>_>::operator[](&this->options,0);
    it._M_node._4_4_ = getopt_long(iVar2,ppcVar1,pcVar4,pvVar5,0);
    if (it._M_node._4_4_ == -1) {
      return true;
    }
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
         ::find(&this->setters,(key_type *)((long)&it._M_node + 4));
    local_60._M_node =
         (_Base_ptr)
         std::
         map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
         ::end(&this->setters);
    bVar3 = std::operator==(&local_58,&local_60);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (&this->was_set,(value_type_conflict2 *)((long)&it._M_node + 4));
    local_70 = (_Base_ptr)pVar7.first._M_node;
    local_68 = pVar7.second;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
             ::operator->(&local_58);
    if (_optarg == (char *)0x0) {
      local_e0 = "";
    }
    else {
      local_e0 = _optarg;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_e0,&local_91);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&ppVar6->second,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return false;
}

Assistant:

inline bool Options::Parse(int argc, char** argv) {
    this->options.push_back({0, 0, 0, 0});
    int ch;
    while ((ch = getopt_long(argc, argv, this->optstr.c_str(), &this->options[0], NULL)) != -1) {
        auto it = this->setters.find(ch);
        if (it != this->setters.end()) {
            this->was_set.insert(ch);
            it->second(optarg ? optarg : "");
        } else {
            return false;
        }
    }
    return true;
}